

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_dense.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  SUNMatrix A;
  SUNMatrix B;
  SUNMatrix A_00;
  N_Vector v;
  N_Vector z;
  N_Vector y;
  long lVar8;
  long lVar9;
  realtype *prVar10;
  SUNLinearSolver S;
  char *__s;
  uint uVar11;
  long lVar12;
  long lVar13;
  
  if (argc < 3) {
    __s = "ERROR: TWO (2) Inputs required: matrix cols, print timing ";
  }
  else {
    lVar7 = atol(argv[1]);
    if (0 < lVar7) {
      iVar1 = atoi(argv[2]);
      SetTiming(iVar1);
      lVar12 = 0;
      printf("\nDense linear solver test: size %ld\n\n",lVar7);
      A = (SUNMatrix)SUNDenseMatrix(lVar7,lVar7);
      B = (SUNMatrix)SUNDenseMatrix(lVar7,lVar7);
      A_00 = (SUNMatrix)SUNDenseMatrix(lVar7,lVar7);
      v = (N_Vector)N_VNew_Serial(lVar7);
      z = (N_Vector)N_VNew_Serial(lVar7);
      y = (N_Vector)N_VNew_Serial(lVar7);
      do {
        lVar8 = SUNDenseMatrix_Column(A,lVar12);
        lVar13 = 0;
        do {
          iVar1 = rand();
          *(double *)(lVar8 + lVar13 * 8) = ((double)iVar1 / 2147483647.0) / (double)lVar7;
          lVar13 = lVar13 + 1;
        } while (lVar7 != lVar13);
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar7);
      lVar8 = 0;
      lVar12 = lVar7;
      do {
        lVar12 = lVar12 + -1;
        lVar13 = SUNDenseMatrix_Column(A_00,lVar12);
        *(undefined8 *)(lVar13 + lVar8) = 0x3ff0000000000000;
        lVar8 = lVar8 + 8;
      } while (lVar12 != 0);
      lVar12 = 0;
      do {
        lVar8 = 0;
        do {
          lVar13 = SUNDenseMatrix_Column(A,lVar8);
          lVar9 = SUNDenseMatrix_Column(A_00,lVar8);
          *(double *)(lVar13 + lVar12 * 8) =
               *(double *)(lVar13 + lVar12 * 8) + *(double *)(lVar9 + lVar12 * 8);
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar7);
      prVar10 = N_VGetArrayPointer(v);
      lVar12 = 0;
      do {
        iVar1 = rand();
        prVar10[lVar12] = (double)iVar1 / 2147483647.0;
        lVar12 = lVar12 + 1;
      } while (lVar7 != lVar12);
      SUNMatCopy(A,B);
      N_VScale(1.0,v,z);
      iVar1 = SUNMatMatvec(A,v,y);
      if (iVar1 != 0) {
        puts("FAIL: SUNLinSol SUNMatMatvec failure");
        SUNMatDestroy(A);
        SUNMatDestroy(B);
        SUNMatDestroy(A_00);
        N_VDestroy(v);
        N_VDestroy(z);
        N_VDestroy(y);
        return 1;
      }
      S = (SUNLinearSolver)SUNLinSol_Dense(v);
      iVar1 = Test_SUNLinSolInitialize(S,0);
      iVar2 = Test_SUNLinSolSetup(S,A,0);
      iVar3 = Test_SUNLinSolSolve(S,A,v,y,2.220446049250313e-15,0);
      iVar4 = Test_SUNLinSolGetType(S,SUNLINEARSOLVER_DIRECT,0);
      iVar5 = Test_SUNLinSolLastFlag(S,0);
      iVar6 = Test_SUNLinSolSpace(S,0);
      uVar11 = iVar6 + iVar5 + iVar4 + iVar2 + iVar1 + iVar3;
      if (uVar11 == 0) {
        puts("SUCCESS: SUNLinSol module passed all tests \n ");
      }
      else {
        printf("FAIL: SUNLinSol module failed %i tests \n \n",(ulong)uVar11);
        puts("\nA (original) =");
        SUNDenseMatrix_Print(B,_stdout);
        puts("\nA (factored) =");
        SUNDenseMatrix_Print(A,_stdout);
        puts("\nx (original) =");
        N_VPrint_Serial(z);
        puts("\nx (computed) =");
        N_VPrint_Serial(v);
      }
      SUNLinSolFree(S);
      SUNMatDestroy(A);
      SUNMatDestroy(B);
      SUNMatDestroy(A_00);
      N_VDestroy(v);
      N_VDestroy(z);
      N_VDestroy(y);
      return uVar11;
    }
    __s = "ERROR: number of matrix columns must be a positive integer ";
  }
  puts(__s);
  return -1;
}

Assistant:

int main(int argc, char *argv[]) 
{
  int             fails = 0;          /* counter for test failures  */
  sunindextype    cols, rows;         /* matrix columns, rows       */
  SUNLinearSolver LS;                 /* solver object              */
  SUNMatrix       A, B, I;            /* test matrices              */
  N_Vector        x, y, b;            /* test vectors               */
  int             print_timing;
  sunindextype    j, k;
  realtype        *colj, *xdata, *colIj;

  /* check input and set matrix dimensions */
  if (argc < 3){
    printf("ERROR: TWO (2) Inputs required: matrix cols, print timing \n");
    return(-1);
  }

  cols = atol(argv[1]); 
  if (cols <= 0) {
    printf("ERROR: number of matrix columns must be a positive integer \n");
    return(-1); 
  }

  rows = cols;

  print_timing = atoi(argv[2]);
  SetTiming(print_timing);

  printf("\nDense linear solver test: size %ld\n\n",
         (long int) cols);

  /* Create matrices and vectors */
  A = SUNDenseMatrix(rows, cols);
  B = SUNDenseMatrix(rows, cols);
  I = SUNDenseMatrix(rows, cols);
  x = N_VNew_Serial(cols);
  y = N_VNew_Serial(cols);
  b = N_VNew_Serial(cols);

  /* Fill A matrix with uniform random data in [0,1/cols] */
  for (j=0; j<cols; j++) {
    colj = SUNDenseMatrix_Column(A, j);
    for (k=0; k<rows; k++)
      colj[k] = (realtype) rand() / (realtype) RAND_MAX / cols;    
  }

  /* Create anti-identity matrix */
  j=cols-1;
  for (k=0; k<rows; k++) {
    colj = SUNDenseMatrix_Column(I,j);
    colj[k] = 1;
    j = j-1;
  }    
  
  /* Add anti-identity to ensure the solver needs to do row-swapping */
  for (k=0; k<rows; k++){
    for(j=0; j<cols; j++){
      colj = SUNDenseMatrix_Column(A,j);
      colIj = SUNDenseMatrix_Column(I,j);
      colj[k]  = colj[k] + colIj[k]; 
   }
  }

  /* Fill x vector with uniform random data in [0,1] */
  xdata = N_VGetArrayPointer(x);
  for (j=0; j<cols; j++) {
    xdata[j] = (realtype) rand() / (realtype) RAND_MAX;
  } 

  /* copy A and x into B and y to print in case of solver failure */
  SUNMatCopy(A, B);
  N_VScale(ONE, x, y);

  /* create right-hand side vector for linear solve */
  fails = SUNMatMatvec(A, x, b);
  if (fails) {
    printf("FAIL: SUNLinSol SUNMatMatvec failure\n");

    /* Free matrices and vectors */
    SUNMatDestroy(A);
    SUNMatDestroy(B);
    SUNMatDestroy(I);
    N_VDestroy(x);
    N_VDestroy(y);
    N_VDestroy(b);

    return(1);
  }

  /* Create dense linear solver */
  LS = SUNLinSol_Dense(x, A);
  
  /* Run Tests */
  fails += Test_SUNLinSolInitialize(LS, 0);
  fails += Test_SUNLinSolSetup(LS, A, 0);
  fails += Test_SUNLinSolSolve(LS, A, x, b, 10*UNIT_ROUNDOFF, 0);
 
  fails += Test_SUNLinSolGetType(LS, SUNLINEARSOLVER_DIRECT, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolSpace(LS, 0);

  /* Print result */
  if (fails) {
    printf("FAIL: SUNLinSol module failed %i tests \n \n", fails);
    printf("\nA (original) =\n");
    SUNDenseMatrix_Print(B,stdout);
    printf("\nA (factored) =\n");
    SUNDenseMatrix_Print(A,stdout);
    printf("\nx (original) =\n");
    N_VPrint_Serial(y);
    printf("\nx (computed) =\n");
    N_VPrint_Serial(x);
  } else {
    printf("SUCCESS: SUNLinSol module passed all tests \n \n");
  }

  /* Free solver, matrix and vectors */
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNMatDestroy(B);
  SUNMatDestroy(I);
  N_VDestroy(x);
  N_VDestroy(y);
  N_VDestroy(b);

  return(fails);
}